

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseLevelCase::iterate(BaseLevelCase *this)

{
  glBindTextureFunc p_Var1;
  glTexStorage2DFunc p_Var2;
  glBindRenderbufferFunc p_Var3;
  glBindFramebufferFunc p_Var4;
  glFramebufferRenderbufferFunc p_Var5;
  Functions *pFVar6;
  int iVar7;
  deUint32 dVar8;
  GLenum err;
  undefined4 extraout_var;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  char *description;
  ConstPixelBufferAccess local_398;
  ConstPixelBufferAccess local_370;
  undefined1 local_341;
  undefined1 local_340 [7];
  bool compareOk;
  ConstPixelBufferAccess local_318;
  PixelBufferAccess local_2f0;
  PixelBufferAccess local_2c8;
  MessageBuilder local_2a0;
  TextureFormat local_120;
  undefined1 local_118 [8];
  TextureLevel stencilOnlyLevel;
  undefined1 local_e8 [8];
  TextureLevel readLevel;
  undefined1 local_b8 [8];
  TextureLevel uploadLevel;
  Texture depthStencilTex;
  undefined1 local_68 [8];
  Renderbuffer colorBuf;
  Framebuffer fbo;
  int levelHeight;
  int levelWidth;
  int levelNdx;
  int height;
  int width;
  Functions *gl;
  RenderContext *renderCtx;
  BaseLevelCase *this_local;
  
  renderCtx = (RenderContext *)this;
  gl = (Functions *)Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (**(_func_int **)((long)gl->activeShaderProgram + 0x18))();
  _height = (Functions *)CONCAT44(extraout_var,iVar7);
  levelNdx = 0x80;
  levelWidth = 0x80;
  levelHeight = 2;
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object,
             (RenderContext *)gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_68,(RenderContext *)gl);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap,(RenderContext *)gl
            );
  readLevel.m_data.m_cap = (size_t)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_b8,(TextureFormat *)&readLevel.m_data.m_cap,0x20,0x20,1);
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)&stencilOnlyLevel.m_data.m_cap,RGBA,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_e8,(TextureFormat *)&stencilOnlyLevel.m_data.m_cap,0x20,0x20,1);
  tcu::TextureFormat::TextureFormat(&local_120,S,UNSIGNED_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_118,&local_120,0x20,0x20,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_2a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_2a0,(char (*) [25])"GL_TEXTURE_BASE_LEVEL = ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&levelHeight);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2a0);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_2c8,(TextureLevel *)local_b8);
  renderTestPatternReference(&local_2c8);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_2f0,(TextureLevel *)local_118);
  renderTestPatternReference(&local_2f0);
  p_Var1 = _height->bindTexture;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
  (*p_Var1)(0xde1,dVar8);
  p_Var2 = _height->texStorage2D;
  iVar7 = de::max<int>(0x80,0x80);
  iVar7 = deLog2Floor32(iVar7);
  (*p_Var2)(0xde1,iVar7 + 1,this->m_format,0x80,0x80);
  (*_height->texParameteri)(0xde1,0x813c,2);
  pFVar6 = gl;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_318,(TextureLevel *)local_b8);
  glu::texSubImage2D((RenderContext *)pFVar6,0xde1,2,0,0,&local_318);
  err = (*_height->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x3ca);
  p_Var3 = _height->bindRenderbuffer;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_68);
  (*p_Var3)(0x8d41,dVar8);
  (*_height->renderbufferStorage)(0x8d41,0x8236,0x20,0x20);
  p_Var4 = _height->bindFramebuffer;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf.super_ObjectWrapper.m_object);
  (*p_Var4)(0x8d40,dVar8);
  p_Var5 = _height->framebufferRenderbuffer;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_68);
  (*p_Var5)(0x8d40,0x8ce0,0x8d41,dVar8);
  checkFramebufferStatus(_height);
  pFVar6 = gl;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
  blitStencilToColor2D((RenderContext *)pFVar6,dVar8,0x20,0x20);
  pFVar6 = gl;
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_340,(TextureLevel *)local_e8)
  ;
  glu::readPixels((RenderContext *)pFVar6,0,0,(PixelBufferAccess *)local_340);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_370,(TextureLevel *)local_118);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_398,(TextureLevel *)local_e8);
  local_341 = compareStencilToRed(pTVar9,&local_370,&local_398);
  description = "Image comparison failed";
  if ((bool)local_341) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_341 & QP_TEST_RESULT_FAIL,description);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_118);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_e8);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b8);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_68);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 128;
		const int					height				= 128;
		const int					levelNdx			= 2;
		const int					levelWidth			= width>>levelNdx;
		const int					levelHeight			= height>>levelNdx;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), levelWidth, levelHeight);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), levelWidth, levelHeight);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), levelWidth, levelHeight);

		checkDepthStencilFormatSupport(m_context, m_format);

		m_testCtx.getLog() << TestLog::Message << "GL_TEXTURE_BASE_LEVEL = " << levelNdx << TestLog::EndMessage;

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, deLog2Floor32(de::max(width, height))+1, m_format, width, height);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, levelNdx);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, levelNdx, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, levelWidth, levelHeight);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, levelWidth, levelHeight);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}